

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O3

void __thiscall Fluid::setup_grid_project(Fluid *this,float dt)

{
  PFNGLUNIFORM1FPROC p_Var1;
  PFNGLUNIFORM3FVPROC p_Var2;
  PFNGLUNIFORM3IVPROC p_Var3;
  GLint GVar4;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  (*glad_glMemoryBarrier)(0xffffffff);
  gfx::Program::use(&this->setup_grid_project_program);
  p_Var1 = glad_glUniform1f;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"dt","");
  GVar4 = (*glad_glGetUniformLocation)((this->setup_grid_project_program).id,(GLchar *)local_50[0]);
  (*p_Var1)(GVar4,dt);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  p_Var2 = glad_glUniform3fv;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"bounds_min","");
  GVar4 = (*glad_glGetUniformLocation)((this->setup_grid_project_program).id,(GLchar *)local_70[0]);
  (*p_Var2)(GVar4,1,(GLfloat *)&this->bounds_min);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  p_Var2 = glad_glUniform3fv;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"bounds_max","");
  GVar4 = (*glad_glGetUniformLocation)((this->setup_grid_project_program).id,(GLchar *)local_90[0]);
  (*p_Var2)(GVar4,1,(GLfloat *)&this->bounds_max);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  p_Var3 = glad_glUniform3iv;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"grid_dim","");
  GVar4 = (*glad_glGetUniformLocation)((this->setup_grid_project_program).id,(GLchar *)local_b0[0]);
  (*p_Var3)(GVar4,1,(GLint *)&this->grid_dimensions);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  (*glad_glValidateProgram)((this->setup_grid_project_program).id);
  gfx::Program::check_validation
            (&this->setup_grid_project_program,(this->setup_grid_project_program).id);
  (*glad_glDispatchCompute)
            ((this->grid_dimensions).field_0.x,(this->grid_dimensions).field_1.y,
             (this->grid_dimensions).field_2.z);
  (*glad_glUseProgram)(0);
  return;
}

Assistant:

void setup_grid_project(float dt) {
        ssbo_barrier();
        setup_grid_project_program.use();
        glUniform1f(setup_grid_project_program.uniform_loc("dt"), dt);
        glUniform3fv(setup_grid_project_program.uniform_loc("bounds_min"), 1, glm::value_ptr(bounds_min));
        glUniform3fv(setup_grid_project_program.uniform_loc("bounds_max"), 1, glm::value_ptr(bounds_max));
        glUniform3iv(setup_grid_project_program.uniform_loc("grid_dim"), 1, glm::value_ptr(grid_dimensions));
        setup_grid_project_program.validate();
        glDispatchCompute(grid_dimensions.x, grid_dimensions.y, grid_dimensions.z);
        setup_grid_project_program.disuse();
    }